

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::copyGroupElements
          (TraverseSchema *this,DOMElement *elem,XercesGroupInfo *fromGroup,XercesGroupInfo *toGroup
          ,ComplexTypeInfo *typeInfo)

{
  ulong uVar1;
  uint uVar2;
  XMLSize_t XVar3;
  QName *pQVar4;
  XMLCh *text1;
  ulong uVar5;
  MemoryManager *pMVar6;
  XMLSize_t XVar7;
  uint key3;
  int iVar8;
  XMLSize_t index;
  SchemaElementDecl *valueToAdopt;
  undefined4 extraout_var;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *pBVar9;
  undefined4 extraout_var_00;
  long lVar10;
  ulong uVar11;
  XMLSize_t getAt;
  
  XVar3 = (fromGroup->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>).fCurCount;
  if (typeInfo == (ComplexTypeInfo *)0x0) {
    key3 = 0;
  }
  else {
    key3 = typeInfo->fScopeDefined;
    fromGroup->fCheckElementConsistency = false;
  }
  if (XVar3 != 0) {
    getAt = 0;
    do {
      valueToAdopt = BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::elementAt
                               (&fromGroup->fElements->
                                 super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>,getAt);
      if (typeInfo == (ComplexTypeInfo *)0x0) goto LAB_00333952;
      uVar2 = valueToAdopt->fEnclosingScope;
      if (uVar2 == 0xfffffffe) {
LAB_0033383b:
        pBVar9 = &typeInfo->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
        if (pBVar9 == (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
          pBVar9 = (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)
                   XMemory::operator_new(0x30,typeInfo->fMemoryManager);
          pMVar6 = typeInfo->fMemoryManager;
          ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&pBVar9->_vptr_BaseRefVectorOf)->
          _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409870;
          pBVar9->fAdoptedElems = false;
          pBVar9->fCurCount = 0;
          pBVar9->fMaxCount = 8;
          pBVar9->fElemList = (SchemaElementDecl **)0x0;
          pBVar9->fMemoryManager = pMVar6;
          iVar8 = (*pMVar6->_vptr_MemoryManager[3])(pMVar6,0x40);
          pBVar9->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var_00,iVar8);
          lVar10 = 0;
          do {
            pBVar9->fElemList[lVar10] = (SchemaElementDecl *)0x0;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 8);
          ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&pBVar9->_vptr_BaseRefVectorOf)->
          _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_004097f8;
          typeInfo->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)pBVar9;
LAB_00333932:
          BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar9,1);
          XVar7 = pBVar9->fCurCount;
          pBVar9->fElemList[XVar7] = valueToAdopt;
          pBVar9->fCurCount = XVar7 + 1;
        }
        else {
          uVar5 = pBVar9->fCurCount;
          if (uVar5 == 0) goto LAB_00333932;
          if (*pBVar9->fElemList != valueToAdopt) {
            uVar11 = 0;
            do {
              if (uVar5 - 1 == uVar11) goto LAB_00333932;
              uVar1 = uVar11 + 1;
              lVar10 = uVar11 + 1;
              uVar11 = uVar1;
            } while (pBVar9->fElemList[lVar10] != valueToAdopt);
            if (uVar5 <= uVar1) goto LAB_00333932;
          }
        }
LAB_00333952:
        if (toGroup != (XercesGroupInfo *)0x0) {
          pBVar9 = &toGroup->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
          uVar5 = pBVar9->fCurCount;
          if (uVar5 == 0) {
LAB_0033398b:
            BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(pBVar9,1);
            XVar7 = pBVar9->fCurCount;
            pBVar9->fElemList[XVar7] = valueToAdopt;
            pBVar9->fCurCount = XVar7 + 1;
          }
          else if (*pBVar9->fElemList != valueToAdopt) {
            uVar11 = 0;
            do {
              if (uVar5 - 1 == uVar11) goto LAB_0033398b;
              uVar1 = uVar11 + 1;
              lVar10 = uVar11 + 1;
              uVar11 = uVar1;
            } while (pBVar9->fElemList[lVar10] != valueToAdopt);
            if (uVar5 <= uVar1) goto LAB_0033398b;
          }
        }
      }
      else {
        pQVar4 = (valueToAdopt->super_XMLElementDecl).fElementName;
        text1 = pQVar4->fLocalPart;
        iVar8 = (*(this->fSchemaGrammar->super_Grammar).super_XSerializable._vptr_XSerializable[0xb]
                )(this->fSchemaGrammar,(ulong)pQVar4->fURIId,text1,0,(ulong)key3);
        lVar10 = CONCAT44(extraout_var,iVar8);
        if (lVar10 == 0) {
          valueToAdopt->fEnclosingScope = key3;
          pQVar4 = (valueToAdopt->super_XMLElementDecl).fElementName;
          RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::put
                    (this->fSchemaGrammar->fGroupElemDeclPool,pQVar4->fLocalPart,pQVar4->fURIId,key3
                     ,valueToAdopt);
          valueToAdopt->fEnclosingScope = uVar2;
          goto LAB_0033383b;
        }
        if ((valueToAdopt->fComplexTypeInfo != *(ComplexTypeInfo **)(lVar10 + 0x50)) ||
           (valueToAdopt->fDatatypeValidator != *(DatatypeValidator **)(lVar10 + 0x78))) {
          reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x43,text1,
                            (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      getAt = getAt + 1;
    } while (getAt != XVar3);
  }
  return;
}

Assistant:

void TraverseSchema::copyGroupElements(const DOMElement* const elem,
                                       XercesGroupInfo* const fromGroup,
                                       XercesGroupInfo* const toGroup,
                                       ComplexTypeInfo* const typeInfo) {

    XMLSize_t elemCount = fromGroup->elementCount();
    int newScope = (typeInfo) ? typeInfo->getScopeDefined() : 0;

    if (typeInfo)
        fromGroup->setCheckElementConsistency(false);

    for (XMLSize_t i = 0; i < elemCount; i++) {

        SchemaElementDecl*       elemDecl = fromGroup->elementAt(i);

        if (typeInfo) {

            unsigned int elemScope = elemDecl->getEnclosingScope();

            if (elemScope != Grammar::TOP_LEVEL_SCOPE) {

                int                      elemURI = elemDecl->getURI();
                const XMLCh*             localPart = elemDecl->getBaseName();
                const SchemaElementDecl* other = (SchemaElementDecl*)
                        fSchemaGrammar->getElemDecl(elemURI, localPart, 0, newScope);

                if (other) {

                    if (elemDecl->getComplexTypeInfo() != other->getComplexTypeInfo()
                        || elemDecl->getDatatypeValidator() != other->getDatatypeValidator()) {
                       reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::DuplicateElementDeclaration, localPart);
                    }

                    continue;
                }

                elemDecl->setEnclosingScope(newScope);
                fSchemaGrammar->putGroupElemDecl(elemDecl);
                elemDecl->setEnclosingScope(elemScope);
            }

            typeInfo->addElement(elemDecl);
        }

        if (toGroup) {
            toGroup->addElement(elemDecl);
        }
    }
}